

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cubeb_log.cpp
# Opt level: O2

void __thiscall cubeb_async_logger::push(cubeb_async_logger *this,char *str)

{
  bool bVar1;
  ring_buffer_base<cubeb_log_message> *owned_queue;
  cubeb_log_message msg;
  
  cubeb_log_message::cubeb_log_message(&msg,str);
  owned_queue = (this->msg_queue)._M_b._M_p;
  if (owned_queue != (__pointer_type)0x0) {
    bVar1 = std::atomic<ring_buffer_base<cubeb_log_message>_*>::compare_exchange_strong
                      (&this->msg_queue,&owned_queue,(__pointer_type)0x0,memory_order_seq_cst);
    if (bVar1) {
      ring_buffer_base<cubeb_log_message>::enqueue(owned_queue,&msg);
      LOCK();
      (this->msg_queue)._M_b._M_p = owned_queue;
      UNLOCK();
    }
  }
  return;
}

Assistant:

void push(char const str[CUBEB_LOG_MESSAGE_MAX_SIZE])
  {
    cubeb_log_message msg(str);
    auto * owned_queue = msg_queue.load();
    // Check if the queue is being deallocated. If not, grab ownership. If yes,
    // return, the message won't be logged.
    if (!owned_queue ||
        !msg_queue.compare_exchange_strong(owned_queue, nullptr)) {
      return;
    }
    owned_queue->enqueue(msg);
    // Return ownership.
    msg_queue.store(owned_queue);
  }